

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_program.h
# Opt level: O3

void __thiscall t_program::set_out_path(t_program *this,string *out_path,bool out_path_is_absolute)

{
  string *psVar1;
  char cVar2;
  size_type sVar3;
  long lVar4;
  
  psVar1 = &this->out_path_;
  std::__cxx11::string::_M_assign((string *)psVar1);
  this->out_path_is_absolute_ = out_path_is_absolute;
  sVar3 = (this->out_path_)._M_string_length;
  lVar4 = sVar3 - 1;
  if (sVar3 == 0) {
    std::__throw_out_of_range_fmt
              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",lVar4,0);
  }
  cVar2 = (psVar1->_M_dataplus)._M_p[lVar4];
  if ((cVar2 != '/') && (cVar2 != '\\')) {
    std::__cxx11::string::push_back((char)psVar1);
    return;
  }
  return;
}

Assistant:

void set_out_path(std::string out_path, bool out_path_is_absolute) {
    out_path_ = out_path;
    out_path_is_absolute_ = out_path_is_absolute;
    // Ensure that it ends with a trailing '/' (or '\' for windows machines)
    char c = out_path_.at(out_path_.size() - 1);
    if (!(c == '/' || c == '\\')) {
      out_path_.push_back('/');
    }
  }